

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

int __thiscall PP_Expression::AND_expression(PP_Expression *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  do {
    uVar2 = equality_expression(this);
    bVar1 = Parser::test(&this->super_Parser,AND);
    uVar3 = uVar3 & uVar2;
  } while (bVar1);
  return uVar3;
}

Assistant:

int PP_Expression::AND_expression()
{
    int value = equality_expression();
    if (test(PP_AND))
        return value & AND_expression();
    return value;
}